

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DisjunctiveIntervalMap.h
# Opt level: O3

set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_> *
__thiscall
dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>::gather
          (set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
           *__return_storage_ptr__,DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *this,
          IntervalT *I)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  const_iterator cVar3;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  cVar3 = le(this,I);
  for (; ((_Rb_tree_header *)cVar3._M_node != &(this->_mapping)._M_t._M_impl.super__Rb_tree_header
         && ((p_Var2 = (_Base_ptr)(I->start).offset,
             *(_Base_ptr *)(cVar3._M_node + 1) <= p_Var2 && p_Var2 <= cVar3._M_node[1]._M_parent ||
             (*(_Base_ptr *)(cVar3._M_node + 1) <= (_Base_ptr)(I->end).offset))));
      cVar3._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar3._M_node)) {
    std::
    _Rb_tree<dg::dda::RWNode*,dg::dda::RWNode*,std::_Identity<dg::dda::RWNode*>,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<dg::dda::RWNode*>>
              ((_Rb_tree<dg::dda::RWNode*,dg::dda::RWNode*,std::_Identity<dg::dda::RWNode*>,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>
                *)__return_storage_ptr__,cVar3._M_node[2]._M_parent,
               (_Rb_tree_const_iterator<dg::dda::RWNode_*>)&cVar3._M_node[1]._M_right);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<ValueT> gather(const IntervalT &I) const {
        std::set<ValueT> ret;

        auto it = le(I);
        if (it == end())
            return ret;

        assert(it->first.overlaps(I) && "The found interval should overlap");
        while (it != end() && it->first.overlaps(I)) {
            ret.insert(it->second.begin(), it->second.end());
            ++it;
        }

        return ret;
    }